

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

opj_image_t * pgxtoimage(char *filename,opj_cparameters_t *parameters)

{
  OPJ_UINT32 OVar1;
  opj_image_comp_t *poVar2;
  byte bVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  FILE *pFVar7;
  long lVar8;
  size_t sVar9;
  sbyte sVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  char cVar14;
  OPJ_UINT32 OVar15;
  uint uVar16;
  size_t sStack_e0;
  char endian2;
  char endian1;
  int local_d0;
  int prec;
  int h;
  int w;
  char ch;
  int local_bc;
  int local_b8;
  int local_b4;
  FILE *local_b0;
  undefined8 local_a8;
  OPJ_UINT32 OStack_a0;
  OPJ_UINT32 OStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  uint local_88;
  opj_image_t *local_80;
  char temp [32];
  char signtmp [32];
  
  local_a8 = 0;
  OStack_a0 = 0;
  OStack_9c = 0;
  local_98 = 0;
  uStack_90 = 0;
  pFVar7 = fopen(filename,"rb");
  if (pFVar7 == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for reading !\n",filename);
    return (opj_image_t *)0x0;
  }
  fseek(pFVar7,0,0);
  pcVar12 = signtmp;
  iVar5 = __isoc99_fscanf(pFVar7,"PG%31[ \t]%c%c%31[ \t+-]%d%31[ \t]%d%31[ \t]%d",temp,&endian1,
                          &endian2,pcVar12,&prec,temp,&w,temp,&h);
  if (iVar5 == 9) {
    cVar14 = '+';
    do {
      if (*pcVar12 == '-') {
        cVar14 = '-';
      }
      else if (*pcVar12 == '\0') goto LAB_0010522f;
      pcVar12 = pcVar12 + 1;
    } while( true );
  }
  fclose(pFVar7);
  pcVar12 = "ERROR: Failed to read the right number of element from the fscanf() function!\n";
  sStack_e0 = 0x4e;
  goto LAB_0010553c;
LAB_0010522f:
  fgetc(pFVar7);
  if (endian2 == 'L' && endian1 == 'M') {
    local_d0 = 1;
LAB_00105271:
    if (((0 < (long)w) && (0 < h)) && (0xffffffe0 < prec - 0x20U)) {
      sVar10 = 2;
      if ((uint)prec < 0x11) {
        sVar10 = 8 < (uint)prec;
      }
      uVar13 = (ulong)(uint)h * (long)w << sVar10;
      if (10000000 < uVar13) {
        lVar8 = ftell(pFVar7);
        uVar11 = 0x7fffffff;
        if (uVar13 < 0x7fffffff) {
          uVar11 = uVar13;
        }
        fseek(pFVar7,uVar11 - 1,0);
        sVar9 = fread(&ch,1,1,pFVar7);
        if (sVar9 != 1) {
          fwrite("File too short\n",0xf,1,_stderr);
          goto LAB_00105563;
        }
        fseek(pFVar7,lVar8,0);
      }
      iVar5 = prec;
      local_98._0_4_ = parameters->image_offset_x0;
      local_98._4_4_ = parameters->image_offset_y0;
      OStack_a0 = parameters->image_offset_x0 + (w + -1) * parameters->subsampling_dx + 1;
      local_a8._0_4_ = parameters->subsampling_dx;
      local_a8._4_4_ = parameters->subsampling_dy;
      OStack_9c = (h + -1) * parameters->subsampling_dy + parameters->image_offset_y0 + 1;
      local_88 = (uint)(cVar14 == '-');
      local_bc = 0;
      local_b4 = 0;
      local_b8 = 0;
      if (prec < 8) {
        local_b4 = 8 - prec;
        local_b8 = prec - local_b4;
        local_bc = 0;
        if (cVar14 == '-') {
          local_bc = 1 << ((char)prec - 1U & 0x1f);
        }
        local_88 = 0;
        prec = 8;
      }
      uStack_90 = CONCAT44(prec,prec);
      OVar15 = 1;
      local_80 = (opj_image_t *)opj_image_create(1,&local_a8,2);
      if (local_80 != (opj_image_t *)0x0) {
        local_80->x0 = (OPJ_UINT32)local_98;
        local_80->y0 = (OPJ_UINT32)local_98;
        local_80->x1 = OStack_a0;
        local_80->y1 = OStack_9c;
        poVar2 = local_80->comps;
        uVar16 = 0;
        local_b0 = pFVar7;
        for (lVar8 = 0; lVar8 < (long)h * (long)w; lVar8 = lVar8 + 1) {
          if (iVar5 < 8) {
            bVar3 = readuchar((FILE *)pFVar7);
            uVar6 = ((uint)bVar3 + local_bc >> ((byte)local_b8 & 0x1f)) +
                    ((uint)bVar3 + local_bc << ((byte)local_b4 & 0x1f));
            poVar2->data[lVar8] = uVar6 & 0xff;
            if ((int)uVar16 < (int)uVar6) {
              uVar16 = uVar6;
            }
          }
          else {
            if (poVar2->prec == 8) {
              OVar1 = poVar2->sgnd;
              bVar3 = readuchar((FILE *)pFVar7);
              pFVar7 = local_b0;
              if (OVar1 == 0) {
                uVar6 = (uint)bVar3;
              }
              else {
                uVar6 = (uint)(char)bVar3;
              }
            }
            else if (poVar2->prec < 0x11) {
              OVar1 = poVar2->sgnd;
              uVar4 = readushort((FILE *)pFVar7,local_d0);
              pFVar7 = local_b0;
              if (OVar1 == 0) {
                uVar6 = (uint)uVar4;
              }
              else {
                uVar6 = (uint)(short)uVar4;
              }
            }
            else {
              uVar6 = readuint((FILE *)pFVar7,local_d0);
            }
            if ((int)uVar16 < (int)uVar6) {
              uVar16 = uVar6;
            }
            poVar2->data[lVar8] = uVar6;
          }
        }
        fclose(pFVar7);
        for (; 1 < (int)uVar16; uVar16 = uVar16 >> 1) {
          OVar15 = OVar15 + 1;
        }
        poVar2->bpp = OVar15;
        return local_80;
      }
LAB_00105563:
      fclose(pFVar7);
      return (opj_image_t *)0x0;
    }
  }
  else if ((endian1 == 'L') && (local_d0 = 0, endian2 == 'M')) goto LAB_00105271;
  fclose(pFVar7);
  pcVar12 = "Bad pgx header, please check input file\n";
  sStack_e0 = 0x28;
LAB_0010553c:
  fwrite(pcVar12,sStack_e0,1,_stderr);
  return (opj_image_t *)0x0;
}

Assistant:

opj_image_t* pgxtoimage(const char *filename, opj_cparameters_t *parameters)
{
    FILE *f = NULL;
    int w, h, prec;
    int i, numcomps, max;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t cmptparm;  /* maximum of 1 component  */
    opj_image_t * image = NULL;
    int adjustS, ushift, dshift, force8;
    OPJ_UINT64 expected_file_size;

    char endian1, endian2, sign;
    char signtmp[32];

    char temp[32];
    int bigendian;
    opj_image_comp_t *comp = NULL;

    numcomps = 1;
    color_space = OPJ_CLRSPC_GRAY;

    memset(&cmptparm, 0, sizeof(opj_image_cmptparm_t));

    max = 0;

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !\n", filename);
        return NULL;
    }

    fseek(f, 0, SEEK_SET);
    if (fscanf(f, "PG%31[ \t]%c%c%31[ \t+-]%d%31[ \t]%d%31[ \t]%d", temp, &endian1,
               &endian2, signtmp, &prec, temp, &w, temp, &h) != 9) {
        fclose(f);
        fprintf(stderr,
                "ERROR: Failed to read the right number of element from the fscanf() function!\n");
        return NULL;
    }

    i = 0;
    sign = '+';
    while (signtmp[i] != '\0') {
        if (signtmp[i] == '-') {
            sign = '-';
        }
        i++;
    }

    fgetc(f);
    if (endian1 == 'M' && endian2 == 'L') {
        bigendian = 1;
    } else if (endian2 == 'M' && endian1 == 'L') {
        bigendian = 0;
    } else {
        fclose(f);
        fprintf(stderr, "Bad pgx header, please check input file\n");
        return NULL;
    }

    if (w < 1 || h < 1 || prec < 1 || prec > 31) {
        fclose(f);
        fprintf(stderr, "Bad pgx header, please check input file\n");
        return NULL;
    }

    expected_file_size =
        (OPJ_UINT64)w * (OPJ_UINT64)h * (prec > 16 ? 4 : prec > 8 ? 2 : 1);
    if (expected_file_size > 10000000U) {
        char ch;
        long curpos = ftell(f);
        if (expected_file_size > (OPJ_UINT64)INT_MAX) {
            expected_file_size = (OPJ_UINT64)INT_MAX;
        }
        fseek(f, (long)expected_file_size - 1, SEEK_SET);
        if (fread(&ch, 1, 1, f) != 1) {
            fprintf(stderr, "File too short\n");
            fclose(f);
            return NULL;
        }
        fseek(f, curpos, SEEK_SET);
    }

    /* initialize image component */

    cmptparm.x0 = (OPJ_UINT32)parameters->image_offset_x0;
    cmptparm.y0 = (OPJ_UINT32)parameters->image_offset_y0;
    cmptparm.w = !cmptparm.x0 ? (OPJ_UINT32)((w - 1) * parameters->subsampling_dx +
                 1) : cmptparm.x0 + (OPJ_UINT32)(w - 1) * (OPJ_UINT32)parameters->subsampling_dx
                 + 1;
    cmptparm.h = !cmptparm.y0 ? (OPJ_UINT32)((h - 1) * parameters->subsampling_dy +
                 1) : cmptparm.y0 + (OPJ_UINT32)(h - 1) * (OPJ_UINT32)parameters->subsampling_dy
                 + 1;

    if (sign == '-') {
        cmptparm.sgnd = 1;
    } else {
        cmptparm.sgnd = 0;
    }
    if (prec < 8) {
        force8 = 1;
        ushift = 8 - prec;
        dshift = prec - ushift;
        if (cmptparm.sgnd) {
            adjustS = (1 << (prec - 1));
        } else {
            adjustS = 0;
        }
        cmptparm.sgnd = 0;
        prec = 8;
    } else {
        ushift = dshift = force8 = adjustS = 0;
    }

    cmptparm.prec = (OPJ_UINT32)prec;
    cmptparm.bpp = (OPJ_UINT32)prec;
    cmptparm.dx = (OPJ_UINT32)parameters->subsampling_dx;
    cmptparm.dy = (OPJ_UINT32)parameters->subsampling_dy;

    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm, color_space);
    if (!image) {
        fclose(f);
        return NULL;
    }
    /* set image offset and reference grid */
    image->x0 = cmptparm.x0;
    image->y0 = cmptparm.x0;
    image->x1 = cmptparm.w;
    image->y1 = cmptparm.h;

    /* set image data */

    comp = &image->comps[0];

    for (i = 0; i < w * h; i++) {
        int v;
        if (force8) {
            v = readuchar(f) + adjustS;
            v = (v << ushift) + (v >> dshift);
            comp->data[i] = (unsigned char)v;

            if (v > max) {
                max = v;
            }

            continue;
        }
        if (comp->prec == 8) {
            if (!comp->sgnd) {
                v = readuchar(f);
            } else {
                v = (char) readuchar(f);
            }
        } else if (comp->prec <= 16) {
            if (!comp->sgnd) {
                v = readushort(f, bigendian);
            } else {
                v = (short) readushort(f, bigendian);
            }
        } else {
            if (!comp->sgnd) {
                v = (int)readuint(f, bigendian);
            } else {
                v = (int) readuint(f, bigendian);
            }
        }
        if (v > max) {
            max = v;
        }
        comp->data[i] = v;
    }
    fclose(f);
    comp->bpp = (OPJ_UINT32)int_floorlog2(max) + 1;

    return image;
}